

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O2

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::HighBDConvolveHorizRSTest_Correctness_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::HighBDConvolveHorizRSTest_Correctness_Test>
           *this)

{
  HighBDConvolveHorizRSTest *this_00;
  
  WithParamInterface<std::tuple<void(*)(unsigned_short_const*,int,unsigned_short*,int,int,int,short_const*,int,int,int),int>>
  ::parameter_ = &this->parameter_;
  this_00 = (HighBDConvolveHorizRSTest *)operator_new(0x30);
  anon_unknown.dwarf_1f38a46::HighBDConvolveHorizRSTest::HighBDConvolveHorizRSTest(this_00);
  (this_00->super_ConvolveHorizRSTestBase<unsigned_short>).super_Test._vptr_Test =
       (_func_int **)&PTR__HighBDConvolveHorizRSTest_00f70c48;
  (this_00->
  super_WithParamInterface<std::tuple<void_(*)(const_unsigned_short_*,_int,_unsigned_short_*,_int,_int,_int,_const_short_*,_int,_int,_int),_int>_>
  )._vptr_WithParamInterface =
       (_func_int **)&PTR__HighBDConvolveHorizRSTest_Correctness_Test_00f70c90;
  return (Test *)this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }